

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  GLFWwindow *window;
  double dVar2;
  GLfloat in_XMM3_Da;
  int height;
  int width;
  int local_20;
  int local_1c;
  
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    fwrite("Failed to initialize GLFW\n",0x1a,1,_stderr);
  }
  else {
    glfwWindowHint(0x21005,0x10);
    handle = glfwCreateWindow(300,300,"Gears",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwSetFramebufferSizeCallback(handle,reshape);
      glfwSetKeyCallback(handle,key);
      glfwMakeContextCurrent(handle);
      glfwSwapInterval(1);
      window = handle;
      glfwGetFramebufferSize(handle,&local_1c,&local_20);
      reshape(window,local_1c,local_20);
      glLightfv(0x4000,0x1203,init_pos);
      glEnable(0xb44);
      glEnable(0xb50);
      glEnable(0x4000);
      glEnable(0xb71);
      gear1 = glGenLists(1);
      glNewList(gear1,0x1300);
      glMaterialfv(0x404,0x1602,init_red);
      gear(1.0,4.0,1.0,0x14,in_XMM3_Da);
      glEndList();
      gear2 = glGenLists(1);
      glNewList(gear2,0x1300);
      glMaterialfv(0x404,0x1602,init_green);
      gear(0.5,2.0,2.0,10,in_XMM3_Da);
      glEndList();
      gear3 = glGenLists(1);
      glNewList(gear3,0x1300);
      glMaterialfv(0x404,0x1602,init_blue);
      gear(1.3,2.0,0.5,10,in_XMM3_Da);
      glEndList();
      glEnable(0xba1);
      while( true ) {
        iVar1 = glfwWindowShouldClose(handle);
        if (iVar1 != 0) break;
        glClear(0x4100);
        glPushMatrix();
        glRotatef(view_rotx,0x3f800000,0,0);
        glRotatef(view_roty,0,0x3f800000,0);
        glRotatef(view_rotz,0,0,0x3f800000);
        glPushMatrix();
        glTranslatef(0xc0400000,0xc0000000);
        glRotatef(angle,0,0,0x3f800000);
        glCallList(gear1);
        glPopMatrix();
        glPushMatrix();
        glTranslatef(0x40466666,0xc0000000);
        glRotatef(-9.0 - (angle + angle),0,0,0x3f800000);
        glCallList(gear2);
        glPopMatrix();
        glPushMatrix();
        glTranslatef(0xc0466666,0x40866666);
        glRotatef(-25.0 - (angle + angle),0);
        glCallList(gear3);
        glPopMatrix();
        glPopMatrix();
        dVar2 = glfwGetTime();
        angle = (float)dVar2 * 100.0;
        glfwSwapBuffers(handle);
        glfwPollEvents();
      }
      glfwTerminate();
      exit(0);
    }
    fwrite("Failed to open GLFW window\n",0x1b,1,_stderr);
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
    GLFWwindow* window;
    int width, height;

    if( !glfwInit() )
    {
        fprintf( stderr, "Failed to initialize GLFW\n" );
        exit( EXIT_FAILURE );
    }

    glfwWindowHint(GLFW_DEPTH_BITS, 16);

    window = glfwCreateWindow( 300, 300, "Gears", NULL, NULL );
    if (!window)
    {
        fprintf( stderr, "Failed to open GLFW window\n" );
        glfwTerminate();
        exit( EXIT_FAILURE );
    }

    // Set callback functions
    glfwSetFramebufferSizeCallback(window, reshape);
    glfwSetKeyCallback(window, key);

    glfwMakeContextCurrent(window);
    glfwSwapInterval( 1 );

    glfwGetFramebufferSize(window, &width, &height);
    reshape(window, width, height);

    // Parse command-line options
    init();

    // Main loop
    while( !glfwWindowShouldClose(window) )
    {
        // Draw gears
        draw();

        // Update animation
        animate();

        // Swap buffers
        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    // Terminate GLFW
    glfwTerminate();

    // Exit program
    exit( EXIT_SUCCESS );
}